

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void refresh_background_priorities(gba_ppu_t *ppu)

{
  int priority;
  int insert_index;
  gba_ppu_t *ppu_local;
  
  insert_index = 0;
  for (priority = 0; priority < 4; priority = priority + 1) {
    if ((uint)((ppu->BG0CNT).raw & 3) == priority) {
      background_priorities[insert_index] = 0;
      insert_index = insert_index + 1;
    }
    if ((uint)((ppu->BG1CNT).raw & 3) == priority) {
      background_priorities[insert_index] = 1;
      insert_index = insert_index + 1;
    }
    if ((uint)((ppu->BG2CNT).raw & 3) == priority) {
      background_priorities[insert_index] = 2;
      insert_index = insert_index + 1;
    }
    if ((uint)((ppu->BG3CNT).raw & 3) == priority) {
      background_priorities[insert_index] = 3;
      insert_index = insert_index + 1;
    }
  }
  return;
}

Assistant:

void refresh_background_priorities(gba_ppu_t* ppu) {
    int insert_index = 0;
    // Insert all backgrounds with a certain priority, counting up
    for (int priority = 0; priority < 4; priority++) {
        if (ppu->BG0CNT.priority == priority) {
            background_priorities[insert_index] = 0;
            insert_index++;
        }
        if (ppu->BG1CNT.priority == priority) {
            background_priorities[insert_index] = 1;
            insert_index++;
        }
        if (ppu->BG2CNT.priority == priority) {
            background_priorities[insert_index] = 2;
            insert_index++;
        }
        if (ppu->BG3CNT.priority == priority) {
            background_priorities[insert_index] = 3;
            insert_index++;
        }
    }
}